

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast.c
# Opt level: O1

int get_number(char *prompt)

{
  int iVar1;
  int i;
  char line [80];
  int local_7c;
  char local_78 [80];
  
  printf("%s",prompt);
  do {
    iVar1 = __isoc99_scanf("%d",&local_7c);
    fgets(local_78,0x50,_stdin);
  } while (iVar1 != 1);
  return local_7c;
}

Assistant:

int get_number(char *prompt)
{
    char line[STRING_MAX];
    int n = 0, i;
    printf("%s", prompt);
    while (n != 1) {
        n = scanf("%d", &i);
        fgets(line, STRING_MAX, stdin);
    }
    return i;
}